

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

float __thiscall Matrix4f::determinant(Matrix4f *this)

{
  uint uVar1;
  float m12_00;
  float m22_00;
  float fVar2;
  float m00_00;
  float m10_00;
  float m20_00;
  uint uVar3;
  float m01_00;
  float m11_00;
  float m21_00;
  uint uVar4;
  float m12_01;
  float m22_01;
  undefined1 auVar5 [16];
  uint *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float cofactor03;
  float cofactor02;
  float cofactor01;
  float cofactor00;
  float m33;
  float m23;
  float m13;
  float m03;
  float m32;
  float m22;
  float m12;
  float m02;
  float m31;
  float m21;
  float m11;
  float m01;
  float m30;
  float m20;
  float m10;
  float m00;
  
  uVar1 = *in_RDI;
  fVar9 = (float)in_RDI[1];
  m12_00 = (float)in_RDI[2];
  m22_00 = (float)in_RDI[3];
  fVar2 = (float)in_RDI[4];
  m00_00 = (float)in_RDI[5];
  m10_00 = (float)in_RDI[6];
  m20_00 = (float)in_RDI[7];
  uVar3 = in_RDI[8];
  m01_00 = (float)in_RDI[9];
  m11_00 = (float)in_RDI[10];
  m21_00 = (float)in_RDI[0xb];
  uVar4 = in_RDI[0xc];
  fVar8 = (float)in_RDI[0xd];
  m12_01 = (float)in_RDI[0xe];
  m22_01 = (float)in_RDI[0xf];
  fVar6 = Matrix3f::determinant3x3(m00_00,m01_00,fVar8,m10_00,m11_00,m12_01,m20_00,m21_00,m22_01);
  fVar7 = Matrix3f::determinant3x3(m01_00,fVar8,fVar9,m11_00,m12_01,m12_00,m21_00,m22_01,m22_00);
  fVar8 = Matrix3f::determinant3x3(fVar8,fVar9,m00_00,m12_01,m12_00,m10_00,m22_01,m22_00,m20_00);
  fVar9 = Matrix3f::determinant3x3(fVar9,m00_00,m01_00,m12_00,m10_00,m11_00,m22_00,m20_00,m21_00);
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416(uVar1),ZEXT416((uint)(fVar2 * -fVar7)));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416(uVar3),auVar5);
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)-fVar9),ZEXT416(uVar4),auVar5);
  return auVar5._0_4_;
}

Assistant:

float Matrix4f::determinant() const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];
	float m30 = m_elements[ 3 ];

	float m01 = m_elements[ 4 ];
	float m11 = m_elements[ 5 ];
	float m21 = m_elements[ 6 ];
	float m31 = m_elements[ 7 ];

	float m02 = m_elements[ 8 ];
	float m12 = m_elements[ 9 ];
	float m22 = m_elements[ 10 ];
	float m32 = m_elements[ 11 ];

	float m03 = m_elements[ 12 ];
	float m13 = m_elements[ 13 ];
	float m23 = m_elements[ 14 ];
	float m33 = m_elements[ 15 ];

	float cofactor00 =  Matrix3f::determinant3x3( m11, m12, m13, m21, m22, m23, m31, m32, m33 );
	float cofactor01 = -Matrix3f::determinant3x3( m12, m13, m10, m22, m23, m20, m32, m33, m30 );
	float cofactor02 =  Matrix3f::determinant3x3( m13, m10, m11, m23, m20, m21, m33, m30, m31 );
	float cofactor03 = -Matrix3f::determinant3x3( m10, m11, m12, m20, m21, m22, m30, m31, m32 );

	return( m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02 + m03 * cofactor03 );
}